

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O2

int ffwopen(FILE **ffp,char *fn,buffer *bp)

{
  uint uVar1;
  int __fd;
  FILE *pFVar2;
  int *piVar3;
  char *pcVar4;
  ulong uVar5;
  
  if (bp == (buffer *)0x0) {
    uVar5 = 0x1b6;
  }
  else {
    uVar1 = (bp->b_fi).fi_mode;
    uVar5 = 0x1b6;
    if (uVar1 != 0) {
      uVar5 = (ulong)(uVar1 & 0xfff);
    }
  }
  __fd = open(fn,0x242,uVar5);
  if (__fd == -1) {
    dobeep();
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    ewprintf("Cannot open file for writing : %s",pcVar4);
  }
  else {
    pFVar2 = fdopen(__fd,"w");
    *ffp = (FILE *)pFVar2;
    if (pFVar2 != (FILE *)0x0) {
      if (bp == (buffer *)0x0) {
        return 0;
      }
      uVar1 = (bp->b_fi).fi_mode;
      if (uVar1 == 0) {
        return 0;
      }
      fchmod(__fd,uVar1 & 0xfff);
      fchown(__fd,(bp->b_fi).fi_uid,(bp->b_fi).fi_gid);
      return 0;
    }
    dobeep();
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    ewprintf("Cannot open file for writing : %s",pcVar4);
    close(__fd);
  }
  return 3;
}

Assistant:

int
ffwopen(FILE ** ffp, const char *fn, struct buffer *bp)
{
	int	fd;
	mode_t	fmode = DEFFILEMODE;

	if (bp && bp->b_fi.fi_mode)
		fmode = bp->b_fi.fi_mode & 07777;

	fd = open(fn, O_RDWR | O_CREAT | O_TRUNC, fmode);
	if (fd == -1) {
		ffp = NULL;
		dobeep();
		ewprintf("Cannot open file for writing : %s", strerror(errno));
		return (FIOERR);
	}

	if ((*ffp = fdopen(fd, "w")) == NULL) {
		dobeep();
		ewprintf("Cannot open file for writing : %s", strerror(errno));
		close(fd);
		return (FIOERR);
	}

	/*
	 * If we have file information, use it.  We don't bother to check for
	 * errors, because there's no a lot we can do about it.  Certainly
	 * trying to change ownership will fail if we aren't root.  That's
	 * probably OK.  If we don't have info, no need to get it, since any
	 * future writes will do the same thing.
	 */
	if (bp && bp->b_fi.fi_mode) {
		fchmod(fd, bp->b_fi.fi_mode & 07777);
		fchown(fd, bp->b_fi.fi_uid, bp->b_fi.fi_gid);
	}
	return (FIOSUC);
}